

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void duckdb_fastpforlib::internal::__fastpack17(uint64_t *in,uint32_t *out)

{
  *out = (uint)*in & 0x1ffff;
  Unroller<(unsigned_short)17,_(unsigned_short)1>::Pack(in,out);
  return;
}

Assistant:

void __fastpack17(const uint64_t *__restrict in, uint32_t *__restrict out) {
	Unroller<17>::Pack(in, out);
}